

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_fast.cpp
# Opt level: O1

void crnlib::dxt_fast::compress_color_block
               (dxt1_block *pDXT1_block,color_quad_u8 *pBlock,bool refine)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  uint high16;
  uint low16;
  uint8 color_selectors [16];
  undefined2 local_30 [2];
  undefined2 local_2c;
  byte abStack_29 [17];
  
  compress_color_block(0x10,pBlock,(uint *)&local_2c,(uint *)local_30,abStack_29 + 1,refine);
  *(undefined2 *)pDXT1_block->m_low_color = local_2c;
  *(undefined2 *)pDXT1_block->m_high_color = local_30[0];
  uVar2 = 0;
  lVar3 = 0x10;
  do {
    uVar1 = uVar2 << 2;
    uVar2 = abStack_29[lVar3] | uVar1;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  pDXT1_block->m_selectors[0] = (uint8)uVar2;
  pDXT1_block->m_selectors[1] = (uint8)(uVar1 >> 8);
  pDXT1_block->m_selectors[2] = (uint8)(uVar1 >> 0x10);
  pDXT1_block->m_selectors[3] = (uint8)(uVar1 >> 0x18);
  return;
}

Assistant:

void compress_color_block(dxt1_block* pDXT1_block, const color_quad_u8* pBlock, bool refine)
        {
            uint8 color_selectors[16];
            uint low16, high16;
            dxt_fast::compress_color_block(16, pBlock, low16, high16, color_selectors, refine);

            pDXT1_block->set_low_color(static_cast<uint16>(low16));
            pDXT1_block->set_high_color(static_cast<uint16>(high16));

            uint mask = 0;
            for (int i = 15; i >= 0; i--)
            {
                mask <<= 2;
                mask |= color_selectors[i];
            }

            pDXT1_block->m_selectors[0] = (uint8)(mask & 0xFF);
            pDXT1_block->m_selectors[1] = (uint8)((mask >> 8) & 0xFF);
            pDXT1_block->m_selectors[2] = (uint8)((mask >> 16) & 0xFF);
            pDXT1_block->m_selectors[3] = (uint8)((mask >> 24) & 0xFF);
        }